

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O1

void __thiscall
AddressFactory_CheckAddressNetType_elements_Test::TestBody
          (AddressFactory_CheckAddressNetType_elements_Test *this)

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar1;
  bool bVar2;
  byte bVar3;
  char cVar4;
  internal iVar5;
  char *in_R9;
  AssertionResult gtest_ar__14;
  AddressFactory factory;
  Script script;
  Pubkey pubkey;
  Address addr;
  AssertHelper local_3b0;
  AssertHelper local_3a8;
  AssertHelper local_3a0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_398 [2];
  undefined1 local_388 [16];
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> local_378 [24]
  ;
  Script local_360;
  undefined1 local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  uchar local_308 [16];
  void *local_2f8;
  void *local_2e0;
  void *local_2c8;
  code *local_2b0 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_238;
  Script local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  Pubkey local_1b0;
  undefined1 **local_198 [2];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  void *local_168;
  void *local_150;
  void *local_138;
  code *local_120 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_a8;
  Script local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_388,kLiquidV1,(vector *)local_198);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_198);
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_198,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af","");
  cfd::core::Pubkey::Pubkey(&local_1b0,(string *)local_198);
  if (local_198[0] != local_188) {
    operator_delete(local_198[0]);
  }
  cfd::core::Address::Address((Address *)local_198);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1c6,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1c7,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1c8,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1c9,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_360._vptr_Script._0_1_ =
       cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((byte)local_360._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1ca,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1cb,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1cc,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1cd,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wpkhAddress((Pubkey *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1cf,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_360,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_360);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d0,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d1,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d2,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_360._vptr_Script._0_1_ =
       cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((byte)local_360._vptr_Script == '\0') {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d3,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d4,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d5,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_360._vptr_Script._0_1_ = bVar3 ^ 1;
  local_360.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_360,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d6,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3b0,(Message *)&local_3a0);
    testing::internal::AssertHelper::~AssertHelper(&local_3b0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_328 + 0x10)) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3a0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3a0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3a0.data_ + 8))();
      }
      local_3a0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_360.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_328 + 0x10);
  local_328._0_8_ = sVar1.ptr_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_328,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac","");
  cfd::core::Script::Script(&local_360,(string *)local_328);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_ !=
      sVar1.ptr_) {
    operator_delete((void *)local_328._0_8_);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2shAddress((Script *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1d9,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1da,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1db,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1dc,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = (internal)
          cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0.data_._0_1_ = iVar5;
  if (iVar5 == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1dd,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1de,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1df,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e0,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wshAddress((Script *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e2,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e3,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e4,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e5,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = (internal)
          cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0.data_._0_1_ = iVar5;
  if (iVar5 == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e6,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e7,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e8,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1e9,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)local_328,kElementsRegtest,(vector *)&local_3a0);
  sVar1.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_328 + 0x10);
  local_388._8_8_ = local_328._8_8_;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(local_378,
            (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            sVar1.ptr_);
  local_328._0_8_ = &PTR__AddressFactory_002dffd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             sVar1.ptr_);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_3a0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2pkhAddress((Pubkey *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1ec,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
          local_328._0_8_ !=
          (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0
         )) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1ed,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1ee,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1ef,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f0,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = (internal)
          cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0.data_._0_1_ = iVar5;
  if (iVar5 == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f1,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f2,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,499,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wpkhAddress((Pubkey *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f5,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
        local_328._0_8_ !=
        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0)
    {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f6,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f7,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f8,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1f9,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = (internal)
          cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0.data_._0_1_ = iVar5;
  if (iVar5 == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1fa,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1fb,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1fc,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2shAddress((Script *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1fe,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
        local_328._0_8_ !=
        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0)
    {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x1ff,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x200,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x201,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x202,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = (internal)
          cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0.data_._0_1_ = iVar5;
  if (iVar5 == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x203,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x204,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x205,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::CreateP2wshAddress((Script *)local_328);
      cfd::core::Address::operator=((Address *)local_198,(Address *)local_328);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1e0);
      cfd::core::Script::~Script(&local_220);
      local_2b0[0] = cfd::core::Psbt::CheckTxInIndex;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_238);
      cfd::core::TapBranch::~TapBranch((TapBranch *)local_2b0);
      if (local_2c8 != (void *)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (void *)0x0) {
        operator_delete(local_2e0);
      }
      if (local_2f8 != (void *)0x0) {
        operator_delete(local_2f8);
      }
      if ((uchar *)local_318._M_allocated_capacity != local_308) {
        operator_delete((void *)local_318._M_allocated_capacity);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_328);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x207,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)local_328);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
        local_328._0_8_ !=
        (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0)
    {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_328._0_8_ + 8))();
      }
      local_328._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x208,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x209,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x20a,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x20b,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar5 = (internal)
          cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_3a0.data_._0_1_ = iVar5;
  if (iVar5 == (internal)0x0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x20c,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar3 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_._0_1_ = (internal)(bVar3 ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar3 != 0) {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x20d,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cVar4 = cfd::AddressFactory::CheckAddressNetType((Address *)local_388,(NetType)local_198);
  local_3a0.data_ = (AssertHelperData *)(CONCAT71(local_3a0.data_._1_7_,cVar4) ^ 1);
  local_398[0].ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar4 != '\0') {
    testing::Message::Message((Message *)&local_3b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_328,(internal *)&local_3a0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_address.cpp"
               ,0x20e,(char *)local_328._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a8,(Message *)&local_3b0);
    testing::internal::AssertHelper::~AssertHelper(&local_3a8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328._0_8_
        != sVar1.ptr_) {
      operator_delete((void *)local_328._0_8_);
    }
    if (local_3b0.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_3b0.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_3b0.data_ + 8))();
      }
      local_3b0.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(local_398,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::~Script(&local_360);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  cfd::core::Script::~Script(&local_90);
  local_120[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_a8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_120);
  if (local_138 != (void *)0x0) {
    operator_delete(local_138);
  }
  if (local_150 != (void *)0x0) {
    operator_delete(local_150);
  }
  if (local_168 != (void *)0x0) {
    operator_delete(local_168);
  }
  if (local_188[0] != local_178) {
    operator_delete(local_188[0]);
  }
  if (local_1b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1b0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_388._0_8_ = &PTR__AddressFactory_002dffd8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (local_378);
  return;
}

Assistant:

TEST(AddressFactory, CheckAddressNetType_elements)
{
  AddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}